

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

string * cmIfCommandError_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *args)

{
  pointer pcVar1;
  string *psVar2;
  WrapQuotes in_R8D;
  pointer this;
  string_view str;
  string sStack_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"given arguments:\n ",(allocator<char> *)&sStack_48);
  pcVar1 = (args->
           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (args->
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pcVar1; this = this + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(this);
    str._M_str = (char *)0x0;
    str._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&sStack_48,(cmOutputConverter *)psVar2->_M_string_length,str,in_R8D);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmIfCommandError(
  std::vector<cmExpandedCommandArgument> const& args)
{
  std::string err = "given arguments:\n ";
  for (cmExpandedCommandArgument const& i : args) {
    err += " ";
    err += cmOutputConverter::EscapeForCMake(i.GetValue());
  }
  err += "\n";
  return err;
}